

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O1

void uenum_close_63(UEnumeration *en)

{
  if (en == (UEnumeration *)0x0) {
    return;
  }
  if (en->close != (UEnumClose *)0x0) {
    if (en->baseContext != (void *)0x0) {
      uprv_free_63(en->baseContext);
    }
    (*en->close)(en);
    return;
  }
  uprv_free_63(en);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uenum_close(UEnumeration* en)
{
    if (en) {
        if (en->close != NULL) {
            if (en->baseContext) {
                uprv_free(en->baseContext);
            }
            en->close(en);
        } else { /* this seems dangerous, but we better kill the object */
            uprv_free(en);
        }
    }
}